

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netpong.cpp
# Opt level: O0

int main(void)

{
  Am_Slot_Key AVar1;
  Am_Slot_Key AVar2;
  ushort uVar3;
  ushort uVar4;
  Am_Wrapper *pAVar5;
  Am_Method_Wrapper *pAVar6;
  Am_Object *pAVar7;
  Am_Object *pAVar8;
  Am_Value_List *pAVar9;
  undefined8 uVar10;
  Am_Constraint *pAVar11;
  Am_Object *pAVar12;
  Am_Object *pAVar13;
  Am_String local_290 [8];
  Am_Object local_288;
  Am_String local_280 [8];
  Am_Object local_278;
  Am_String local_270 [8];
  Am_Object local_268;
  Am_String local_260 [8];
  Am_Object local_258;
  Am_String local_250 [8];
  Am_Object local_248;
  Am_Object local_240;
  Am_Object local_238;
  Am_Object local_230;
  Am_Object local_228;
  Am_Object local_220;
  Am_Object local_218;
  Am_Object local_210;
  Am_Object local_208;
  Am_Object local_200;
  Am_Formula local_1f8 [16];
  Am_Object local_1e8;
  Am_Object local_1e0;
  Am_Formula local_1d8 [16];
  Am_Formula local_1c8 [16];
  Am_Object local_1b8;
  Am_Object local_1b0;
  Am_Formula local_1a8 [16];
  Am_Formula local_198 [16];
  Am_Object local_188;
  Am_Object local_180;
  Am_Object local_178;
  Am_Object local_170;
  Am_Object local_168;
  Am_Value_List local_160 [16];
  Am_Object local_150;
  Am_Object local_148;
  Am_Object local_140;
  Am_Object local_138;
  Am_Formula local_130 [16];
  Am_Object local_120;
  Am_Object local_118;
  Am_Formula local_110 [16];
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Value_List local_e0 [16];
  Am_Object local_d0;
  Am_Value_List local_c8 [16];
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object start_button_proto;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object ball_proto;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object paddle_proto;
  Am_Object local_40;
  Am_Time local_38 [24];
  Am_Object local_20;
  Am_Font local_18 [8];
  Am_Font bigfont;
  
  Am_Initialize();
  Am_Font::Am_Font(local_18,Am_FONT_SERIF,true,false,false,Am_FONT_LARGE);
  Am_Object::Create((char *)&local_20);
  uVar3 = Am_Object::Set((ushort)&local_20,true,0);
  uVar3 = Am_Object::Set(uVar3,true,0);
  uVar3 = Am_Object::Set(uVar3,true,1);
  uVar3 = Am_Object::Set(uVar3,true,1);
  uVar3 = Am_Object::Set(uVar3,0xcd,0xffffff9c);
  Am_Time::Am_Time(local_38,0x14);
  pAVar5 = Am_Time::operator_cast_to_Am_Wrapper_(local_38);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0xe9,(ulong)pAVar5);
  Am_Object::Create((char *)&paddle_proto);
  pAVar6 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&ball_anim_method);
  pAVar7 = (Am_Object *)
           Am_Object::Set((ushort)&paddle_proto,(Am_Method_Wrapper *)0xc8,(ulong)pAVar6);
  pAVar7 = (Am_Object *)Am_Object::operator=(&anim_cmd,pAVar7);
  Am_Object::Am_Object(&local_40,pAVar7);
  pAVar7 = (Am_Object *)Am_Object::Set_Part(uVar3,(Am_Object *)0xc5,(ulong)&local_40);
  Am_Object::operator=(&anim,pAVar7);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&paddle_proto);
  Am_Time::~Am_Time(local_38);
  Am_Object::~Am_Object(&local_20);
  Am_Object::Create((char *)&local_58);
  uVar3 = Am_Object::Set((ushort)&local_58,0x65,200);
  uVar3 = Am_Object::Set(uVar3,100,10);
  uVar3 = Am_Object::Set(uVar3,0x66,10);
  uVar3 = Am_Object::Set(uVar3,0x67,0x3c);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
  pAVar7 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  Am_Object::Create((char *)&local_68);
  pAVar6 = Am_Current_Location_Method::operator_cast_to_Am_Method_Wrapper_(&paddle_interim_do);
  uVar3 = Am_Object::Set((ushort)&local_68,(Am_Method_Wrapper *)0xc8,(ulong)pAVar6);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar3,0xca,0);
  Am_Object::Am_Object(&local_60,pAVar8);
  uVar3 = Am_Object::Add_Part(pAVar7,SUB81(&local_60,0),1);
  Am_Value_List::Am_Value_List((Am_Value_List *)&ball_proto);
  pAVar9 = (Am_Value_List *)Am_Value_List::Add(&ball_proto,0x65,1);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar9);
  pAVar7 = (Am_Object *)Am_Object::Add(uVar3,(Am_Wrapper *)0xb8,(ulong)pAVar5);
  Am_Object::Am_Object(&local_50,pAVar7);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&ball_proto);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_58);
  Am_Object::Create((char *)&local_88);
  uVar3 = Am_Object::Set((ushort)&local_88,true,0);
  uVar3 = Am_Object::Set(uVar3,0x65,200);
  uVar3 = Am_Object::Set(uVar3,100,200);
  uVar3 = Am_Object::Set(uVar3,0x66,0x15);
  uVar3 = Am_Object::Set(uVar3,0x67,0x15);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Yellow);
  pAVar7 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Am_Object(&local_90,(Am_Object *)&anim);
  uVar3 = Am_Object::Add_Part(pAVar7,SUB81(&local_90,0),1);
  Am_Value_List::Am_Value_List((Am_Value_List *)&start_button_proto);
  uVar10 = Am_Value_List::Add(&start_button_proto,0x65,1);
  uVar10 = Am_Value_List::Add(uVar10,100,1);
  pAVar9 = (Am_Value_List *)Am_Value_List::Add(uVar10,0x69,1);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar9);
  pAVar7 = (Am_Object *)Am_Object::Add(uVar3,(Am_Wrapper *)0xb8,(ulong)pAVar5);
  Am_Object::Am_Object(&local_80,pAVar7);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&start_button_proto);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_88);
  Am_Object::Create((char *)&local_b0);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_
                      ((Am_Formula *)&Am_Center_X_Is_Center_Of_Owner);
  uVar3 = Am_Object::Set((ushort)&local_b0,(Am_Constraint *)0x64,(ulong)pAVar11);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_
                      ((Am_Formula *)&Am_Center_Y_Is_Center_Of_Owner);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x65,(ulong)pAVar11);
  pAVar5 = Am_Font::operator_cast_to_Am_Wrapper_(local_18);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0xac,(ulong)pAVar5);
  uVar3 = Am_Object::Set(uVar3,0x66,100);
  uVar3 = Am_Object::Set(uVar3,0x67,100);
  Am_Object::Create((char *)&local_b8);
  uVar4 = Am_Object::Set((ushort)&local_b8,(char *)0x150,0x1080a1);
  pAVar6 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&start_button_method);
  pAVar12 = (Am_Object *)Am_Object::Set(uVar4,(Am_Method_Wrapper *)0xca,(ulong)pAVar6);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar12);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0xc5,(ulong)pAVar5);
  AVar1 = RUNNING;
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)visible_trigger);
  uVar3 = Am_Object::Add(uVar3,(Am_Constraint *)(ulong)AVar1,(ulong)pAVar11);
  Am_Value_List::Am_Value_List(local_c8);
  uVar10 = Am_Value_List::Add(local_c8,0x69,1);
  pAVar9 = (Am_Value_List *)Am_Value_List::Add(uVar10,RUNNING,1);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar9);
  pAVar7 = (Am_Object *)Am_Object::Add(uVar3,(Am_Wrapper *)0xb8,(ulong)pAVar5);
  Am_Object::Am_Object(&local_a8,pAVar7);
  Am_Value_List::~Am_Value_List(local_c8);
  Am_Object::~Am_Object(&local_b8);
  Am_Object::~Am_Object(&local_b0);
  Am_Object::Create((char *)&local_d0);
  uVar3 = Am_Object::Set((ushort)&local_d0,(char *)0x6c,0x1080b4);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Amulet_Purple);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  uVar3 = Am_Object::Set(uVar3,0x66,600);
  uVar3 = Am_Object::Set(uVar3,0x67,0x1c2);
  uVar3 = Am_Object::Add(uVar3,(uint)PLAYER1_SCORE,0);
  uVar3 = Am_Object::Add(uVar3,(uint)PLAYER2_SCORE,0);
  Am_Value_List::Am_Value_List(local_e0);
  uVar10 = Am_Value_List::Add(local_e0,PLAYER1_SCORE,1);
  pAVar9 = (Am_Value_List *)Am_Value_List::Add(uVar10,PLAYER2_SCORE,1);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar9);
  uVar3 = Am_Object::Add(uVar3,(Am_Wrapper *)0xb8,(ulong)pAVar5);
  AVar1 = LABEL1;
  Am_Object::Create((char *)&local_f0);
  uVar4 = Am_Object::Set((ushort)&local_f0,100,10);
  uVar4 = Am_Object::Set(uVar4,0x65,0xc);
  uVar4 = Am_Object::Set(uVar4,(char *)0xab,0x1080c0);
  pAVar5 = Am_Font::operator_cast_to_Am_Wrapper_(local_18);
  uVar4 = Am_Object::Set(uVar4,(Am_Wrapper *)0xac,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  pAVar7 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  Am_Object::Am_Object(&local_e8,pAVar7);
  uVar3 = Am_Object::Add_Part(uVar3,(Am_Object *)(ulong)AVar1,(ulong)&local_e8);
  AVar2 = SCORE1;
  Am_Object::Create((char *)&local_100);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  uVar4 = Am_Object::Set((ushort)&local_100,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)right_of_label1);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0x64,(ulong)pAVar11);
  uVar4 = Am_Object::Set(uVar4,0x65,0xc);
  AVar1 = SCORE;
  Am_From_Owner((ushort)local_110);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_(local_110);
  uVar4 = Am_Object::Add(uVar4,(Am_Constraint *)(ulong)AVar1,(ulong)pAVar11);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)score_as_string);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0xab,(ulong)pAVar11);
  pAVar5 = Am_Font::operator_cast_to_Am_Wrapper_(local_18);
  pAVar7 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0xac,(ulong)pAVar5);
  Am_Object::Am_Object(&local_f8,pAVar7);
  uVar3 = Am_Object::Add_Part(uVar3,(Am_Object *)(ulong)AVar2,(ulong)&local_f8);
  uVar3 = Am_Object::Set(uVar3,0xa0,10);
  AVar2 = SCORE2;
  Am_Object::Create((char *)&local_120);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  uVar4 = Am_Object::Set((ushort)&local_120,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Right_Is_Right_Of_Owner);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0x64,(ulong)pAVar11);
  uVar4 = Am_Object::Set(uVar4,0x65,0xc);
  AVar1 = SCORE;
  Am_From_Owner((ushort)local_130);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_(local_130);
  uVar4 = Am_Object::Add(uVar4,(Am_Constraint *)(ulong)AVar1,(ulong)pAVar11);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)score_as_string);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0xab,(ulong)pAVar11);
  pAVar5 = Am_Font::operator_cast_to_Am_Wrapper_(local_18);
  pAVar7 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0xac,(ulong)pAVar5);
  Am_Object::Am_Object(&local_118,pAVar7);
  uVar3 = Am_Object::Add_Part(uVar3,(Am_Object *)(ulong)AVar2,(ulong)&local_118);
  AVar1 = LABEL2;
  Am_Object::Create((char *)&local_140);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)left_of_score2);
  uVar4 = Am_Object::Set((ushort)&local_140,(Am_Constraint *)0x64,(ulong)pAVar11);
  uVar4 = Am_Object::Set(uVar4,0x65,0xc);
  uVar4 = Am_Object::Set(uVar4,(char *)0xab,0x1080c0);
  pAVar5 = Am_Font::operator_cast_to_Am_Wrapper_(local_18);
  uVar4 = Am_Object::Set(uVar4,(Am_Wrapper *)0xac,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  pAVar7 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  Am_Object::Am_Object(&local_138,pAVar7);
  pAVar7 = (Am_Object *)Am_Object::Add_Part(uVar3,(Am_Object *)(ulong)AVar1,(ulong)&local_138);
  Am_Object::Create((char *)&local_150);
  uVar3 = Am_Object::Set((ushort)&local_150,0x65,10);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_
                      ((Am_Formula *)&Am_Center_X_Is_Center_Of_Owner);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x64,(ulong)pAVar11);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Horizontal_Layout);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x94,(ulong)pAVar11);
  uVar3 = Am_Object::Set(uVar3,0x95,10);
  uVar3 = Am_Object::Set(uVar3,true,0);
  Am_Value_List::Am_Value_List(local_160);
  Am_Object::Create((char *)&local_168);
  uVar4 = Am_Object::Set((ushort)&local_168,(char *)0x150,0x1080e6);
  pAVar6 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&new_game_method);
  pAVar12 = (Am_Object *)Am_Object::Set(uVar4,(Am_Method_Wrapper *)0xca,(ulong)pAVar6);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar12);
  uVar10 = Am_Value_List::Add(local_160,pAVar5,1);
  Am_Object::Create((char *)&local_170);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_170);
  uVar10 = Am_Value_List::Add(uVar10,pAVar5,1);
  Am_Object::Create((char *)&local_178);
  uVar4 = Am_Object::Set((ushort)&local_178,(char *)0x150,0x1080fc);
  pAVar6 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&connect_to_remote_method);
  pAVar12 = (Am_Object *)Am_Object::Set(uVar4,(Am_Method_Wrapper *)0xca,(ulong)pAVar6);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar12);
  pAVar9 = (Am_Value_List *)Am_Value_List::Add(uVar10,pAVar5,1);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar9);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0xa2,(ulong)pAVar5);
  Am_Object::Am_Object(&local_148,pAVar8);
  pAVar7 = (Am_Object *)Am_Object::Add_Part(pAVar7,SUB81(&local_148,0),1);
  Am_Object::Create((char *)&local_188);
  uVar3 = Am_Object::Set((ushort)&local_188,100,0);
  uVar3 = Am_Object::Set(uVar3,0x65,0x32);
  Am_From_Owner((ushort)local_198);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_(local_198);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x66,(ulong)pAVar11);
  Am_From_Owner((ushort)local_1a8,0x67,1.0);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_(local_1a8);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x67,(ulong)pAVar11);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Black);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Am_Object(&local_180,pAVar8);
  pAVar7 = (Am_Object *)Am_Object::Add_Part(pAVar7,SUB81(&local_180,0),1);
  Am_Object::Create((char *)&local_1b8);
  uVar3 = Am_Object::Set((ushort)&local_1b8,100,0);
  uVar3 = Am_Object::Set(uVar3,0x65,0x32);
  Am_From_Owner((ushort)local_1c8);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_(local_1c8);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x66,(ulong)pAVar11);
  Am_From_Owner((ushort)local_1d8,0x67,1.0);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_(local_1d8);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar3,(Am_Constraint *)0x67,(ulong)pAVar11);
  Am_Object::Create((char *)&local_1e8);
  uVar3 = Am_Object::Set((ushort)&local_1e8,0x65,0);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_
                      ((Am_Formula *)&Am_Center_X_Is_Center_Of_Owner);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x64,(ulong)pAVar11);
  uVar3 = Am_Object::Set(uVar3,0x66,3);
  Am_From_Owner((ushort)local_1f8);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_(local_1f8);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x67,(ulong)pAVar11);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
  pAVar13 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Am_Object(&local_1e0,pAVar13);
  pAVar8 = (Am_Object *)Am_Object::Add_Part(pAVar8,SUB81(&local_1e0,0),1);
  Am_Object::Create((char *)&local_208);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  pAVar13 = (Am_Object *)Am_Object::Set((ushort)&local_208,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  pAVar13 = (Am_Object *)Am_Object::operator=(&paddle1,pAVar13);
  Am_Object::Am_Object(&local_200,pAVar13);
  uVar3 = Am_Object::Add_Part(pAVar8,false,1);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar3,0xa0,10);
  Am_Object::Create((char *)&local_218);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  uVar3 = Am_Object::Set((ushort)&local_218,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  pAVar13 = (Am_Object *)Am_Object::Set(uVar3,100,0x24e);
  pAVar13 = (Am_Object *)Am_Object::operator=(&paddle2,pAVar13);
  Am_Object::Am_Object(&local_210,pAVar13);
  pAVar8 = (Am_Object *)Am_Object::Add_Part(pAVar8,SUB81(&local_210,0),1);
  Am_Object::Create((char *)&local_228);
  pAVar13 = (Am_Object *)Am_Object::operator=(&ball,(Am_Object *)&local_228);
  Am_Object::Am_Object(&local_220,pAVar13);
  pAVar8 = (Am_Object *)Am_Object::Add_Part(pAVar8,SUB81(&local_220,0),1);
  Am_Object::Create((char *)&local_238);
  pAVar13 = (Am_Object *)Am_Object::operator=(&start_button,(Am_Object *)&local_238);
  Am_Object::Am_Object(&local_230,pAVar13);
  pAVar8 = (Am_Object *)Am_Object::Add_Part(pAVar8,SUB81(&local_230,0),1);
  pAVar8 = (Am_Object *)Am_Object::operator=(&main_group,pAVar8);
  Am_Object::Am_Object(&local_1b0,pAVar8);
  pAVar7 = (Am_Object *)Am_Object::Add_Part(pAVar7,SUB81(&local_1b0,0),1);
  Am_Object::operator=(&window,pAVar7);
  Am_Object::~Am_Object(&local_1b0);
  Am_Object::~Am_Object(&local_230);
  Am_Object::~Am_Object(&local_238);
  Am_Object::~Am_Object(&local_220);
  Am_Object::~Am_Object(&local_228);
  Am_Object::~Am_Object(&local_210);
  Am_Object::~Am_Object(&local_218);
  Am_Object::~Am_Object(&local_200);
  Am_Object::~Am_Object(&local_208);
  Am_Object::~Am_Object(&local_1e0);
  Am_Formula::~Am_Formula(local_1f8);
  Am_Object::~Am_Object(&local_1e8);
  Am_Formula::~Am_Formula(local_1d8);
  Am_Formula::~Am_Formula(local_1c8);
  Am_Object::~Am_Object(&local_1b8);
  Am_Object::~Am_Object(&local_180);
  Am_Formula::~Am_Formula(local_1a8);
  Am_Formula::~Am_Formula(local_198);
  Am_Object::~Am_Object(&local_188);
  Am_Object::~Am_Object(&local_148);
  Am_Object::~Am_Object(&local_178);
  Am_Object::~Am_Object(&local_170);
  Am_Object::~Am_Object(&local_168);
  Am_Value_List::~Am_Value_List(local_160);
  Am_Object::~Am_Object(&local_150);
  Am_Object::~Am_Object(&local_138);
  Am_Object::~Am_Object(&local_140);
  Am_Object::~Am_Object(&local_118);
  Am_Formula::~Am_Formula(local_130);
  Am_Object::~Am_Object(&local_120);
  Am_Object::~Am_Object(&local_f8);
  Am_Formula::~Am_Formula(local_110);
  Am_Object::~Am_Object(&local_100);
  Am_Object::~Am_Object(&local_e8);
  Am_Object::~Am_Object(&local_f0);
  Am_Value_List::~Am_Value_List(local_e0);
  Am_Object::~Am_Object(&local_d0);
  Am_Object::Am_Object(&local_240,(Am_Object *)&window);
  Am_Object::Add_Part((Am_Object *)&Am_Screen,SUB81(&local_240,0),1);
  Am_Object::~Am_Object(&local_240);
  Am_Object::Am_Object(&local_248,(Am_Object *)&paddle1);
  Am_String::Am_String(local_250,"net_paddle1",true);
  Am_Network_Group::Link(&Am_Network,&local_248,local_250);
  Am_String::~Am_String(local_250);
  Am_Object::~Am_Object(&local_248);
  Am_Object::Am_Object(&local_258,(Am_Object *)&paddle2);
  Am_String::Am_String(local_260,"net_paddle2",true);
  Am_Network_Group::Link(&Am_Network,&local_258,local_260);
  Am_String::~Am_String(local_260);
  Am_Object::~Am_Object(&local_258);
  Am_Object::Am_Object(&local_268,(Am_Object *)&ball);
  Am_String::Am_String(local_270,"net_ball",true);
  Am_Network_Group::Link(&Am_Network,&local_268,local_270);
  Am_String::~Am_String(local_270);
  Am_Object::~Am_Object(&local_268);
  Am_Object::Am_Object(&local_278,(Am_Object *)&start_button);
  Am_String::Am_String(local_280,"net_start",true);
  Am_Network_Group::Link(&Am_Network,&local_278,local_280);
  Am_String::~Am_String(local_280);
  Am_Object::~Am_Object(&local_278);
  Am_Object::Am_Object(&local_288,(Am_Object *)&window);
  Am_String::Am_String(local_290,"net_score_keeper",true);
  Am_Network_Group::Link(&Am_Network,&local_288,local_290);
  Am_String::~Am_String(local_290);
  Am_Object::~Am_Object(&local_288);
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Object::~Am_Object(&local_a8);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_50);
  Am_Font::~Am_Font(local_18);
  return 0;
}

Assistant:

int
main()
{
  Am_Initialize();
  Am_Font bigfont(Am_FONT_SERIF, true, false, false, Am_FONT_LARGE);
  anim =
      Am_Animation_Interactor.Create("anim")
          .Set(Am_START_WHEN, false)
          .Set(Am_STOP_WHEN, false)
          .Set(Am_START_WHERE_TEST, true)
          .Set(Am_RUN_ALSO, true)
          .Set(Am_PRIORITY, -100)            //let other interactors run
          .Set(Am_REPEAT_DELAY, Am_Time(20)) //milliseconds between increments
          .Set_Part(Am_COMMAND,
                    anim_cmd =
                        Am_Animation_Command.Create("anim_cmd")
                            .Set(Am_INTERIM_DO_METHOD, ball_anim_method));

  Am_Object paddle_proto =
      Am_Rectangle.Create()
          .Set(Am_TOP, 200)
          .Set(Am_LEFT, 10)
          .Set(Am_WIDTH, paddle_width)
          .Set(Am_HEIGHT, paddle_height)
          .Set(Am_LINE_STYLE, Am_No_Style)
          .Add_Part(Am_Move_Grow_Interactor.Create("paddle1move")
                        .Set(Am_INTERIM_DO_METHOD, paddle_interim_do)
                        .Set(Am_DO_METHOD, 0L))
          .Add(Am_SLOTS_TO_SAVE, Am_Value_List().Add(Am_TOP));

  Am_Object ball_proto =
      Am_Arc.Create()
          .Set(Am_VISIBLE, false)
          .Set(Am_TOP, 200)
          .Set(Am_LEFT, 200)
          .Set(Am_WIDTH, ball_size)
          .Set(Am_HEIGHT, ball_size)
          .Set(Am_LINE_STYLE, Am_No_Style)
          .Set(Am_FILL_STYLE, Am_Yellow)
          .Add_Part(anim)
          .Add(Am_SLOTS_TO_SAVE,
               Am_Value_List().Add(Am_TOP).Add(Am_LEFT).Add(Am_VISIBLE));

  Am_Object start_button_proto =
      Am_Button.Create()
          .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
          .Set(Am_TOP, Am_Center_Y_Is_Center_Of_Owner)
          .Set(Am_FONT, bigfont)
          .Set(Am_WIDTH, 100)
          .Set(Am_HEIGHT, 100)
          .Set(Am_COMMAND, Am_Command.Create()
                               .Set(Am_LABEL, "Start!")
                               .Set(Am_DO_METHOD, start_button_method))
          .Add(RUNNING, visible_trigger)
          .Add(Am_SLOTS_TO_SAVE, Am_Value_List().Add(Am_VISIBLE).Add(RUNNING));

  window =
      Am_Window.Create("Main_Window")
          .Set(Am_TITLE, "Amulet PONG")
          .Set(Am_FILL_STYLE, Am_Amulet_Purple)
          .Set(Am_WIDTH, 600)
          .Set(Am_HEIGHT, 450)
          .Add(PLAYER1_SCORE, 0)
          .Add(PLAYER2_SCORE, 0)
          .Add(Am_SLOTS_TO_SAVE,
               Am_Value_List().Add(PLAYER1_SCORE).Add(PLAYER2_SCORE))
          .Add_Part(LABEL1, Am_Text.Create("label1")
                                .Set(Am_LEFT, 10)
                                .Set(Am_TOP, score_top)
                                .Set(Am_TEXT, "Score:")
                                .Set(Am_FONT, bigfont)
                                .Set(Am_LINE_STYLE, Am_Red))
          .Add_Part(SCORE1, Am_Text.Create("score1")
                                .Set(Am_LINE_STYLE, Am_Red)
                                .Set(Am_LEFT, right_of_label1)
                                .Set(Am_TOP, score_top)
                                .Add(SCORE, Am_From_Owner(PLAYER1_SCORE))
                                .Set(Am_TEXT, score_as_string)
                                .Set(Am_FONT, bigfont))
          .Set(Am_RIGHT_OFFSET, 10)
          .Add_Part(SCORE2, Am_Text.Create("score2")
                                .Set(Am_LINE_STYLE, Am_Blue)
                                .Set(Am_LEFT, Am_Right_Is_Right_Of_Owner)
                                .Set(Am_TOP, score_top)
                                .Add(SCORE, Am_From_Owner(PLAYER2_SCORE))
                                .Set(Am_TEXT, score_as_string)
                                .Set(Am_FONT, bigfont))
          .Add_Part(LABEL2, Am_Text.Create("label2")
                                .Set(Am_LEFT, left_of_score2)
                                .Set(Am_TOP, score_top)
                                .Set(Am_TEXT, "Score:")
                                .Set(Am_FONT, bigfont)
                                .Set(Am_LINE_STYLE, Am_Blue))
          .Add_Part(
              Am_Button_Panel.Create("buttons")
                  .Set(Am_TOP, score_top - 2)
                  .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
                  .Set(Am_LAYOUT, Am_Horizontal_Layout)
                  .Set(Am_H_SPACING, 10)
                  .Set(Am_FIXED_WIDTH, false)
                  .Set(Am_ITEMS,
                       Am_Value_List()
                           .Add(Am_Command.Create("new game")
                                    .Set(Am_LABEL, "New Game")
                                    .Set(Am_DO_METHOD, new_game_method))
                           .Add(Am_Quit_No_Ask_Command.Create())
                           .Add(Am_Command.Create("connect user")
                                    .Set(Am_LABEL, "Connect to Remote User")
                                    .Set(Am_DO_METHOD,
                                         connect_to_remote_method))))
          .Add_Part(Am_Border_Rectangle.Create()
                        .Set(Am_LEFT, 0)
                        .Set(Am_TOP, top_height)
                        .Set(Am_WIDTH, Am_From_Owner(Am_WIDTH))
                        .Set(Am_HEIGHT, Am_From_Owner(Am_HEIGHT, -top_height))
                        .Set(Am_FILL_STYLE, Am_Black))
          .Add_Part(
              main_group =
                  Am_Group.Create("main group")
                      .Set(Am_LEFT, 0)
                      .Set(Am_TOP, top_height)
                      .Set(Am_WIDTH, Am_From_Owner(Am_WIDTH))
                      .Set(Am_HEIGHT, Am_From_Owner(Am_HEIGHT, -top_height))
                      .Add_Part(
                          Am_Rectangle.Create("center")
                              .Set(Am_TOP, 0)
                              .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
                              .Set(Am_WIDTH, 3)
                              .Set(Am_HEIGHT, Am_From_Owner(Am_HEIGHT))
                              .Set(Am_LINE_STYLE, Am_No_Style)
                              .Set(Am_FILL_STYLE, Am_White))
                      .Add_Part(paddle1 = paddle_proto.Create().Set(
                                    Am_FILL_STYLE, Am_Red))
                      .Set(Am_RIGHT_OFFSET, 10)
                      .Add_Part(paddle2 = paddle_proto.Create()
                                              .Set(Am_FILL_STYLE, Am_Blue)
                                              .Set(Am_LEFT, 590))
                      .Add_Part(ball = ball_proto.Create())

                      .Add_Part(start_button = start_button_proto.Create()))

      ;
  Am_Screen.Add_Part(window);

  Am_Network.Link(paddle1, "net_paddle1");
  Am_Network.Link(paddle2, "net_paddle2");
  Am_Network.Link(ball, "net_ball");
  Am_Network.Link(start_button, "net_start");
  Am_Network.Link(window, "net_score_keeper");

  Am_Main_Event_Loop();
  Am_Cleanup();
  return 0;
}